

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall mjs::parser::check_token(parser *this)

{
  token *this_00;
  token_type tVar1;
  bool bVar2;
  long lVar3;
  wostream *pwVar4;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  ulong uVar6;
  wchar_t *in_R9;
  wstring_view message;
  wstring_view message_00;
  wostringstream _oss;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  uint32_t local_1b8;
  undefined4 local_1b4;
  wstring local_1b0;
  token local_190 [9];
  
  this_00 = &this->current_token_;
  token::operator=(this_00,&(this->lexer_).current_token_);
  bVar2 = is_reserved((this->current_token_).type_,this->version_);
  if (bVar2) {
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_190);
    pwVar4 = mjs::operator<<((wostream *)local_190,this_00->type_);
    pwVar4 = std::operator<<(pwVar4," is reserved in ");
    mjs::operator<<(pwVar4,this->version_);
    local_1c8 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    local_1c0 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
      }
    }
    local_1b8 = this->token_start_;
    local_1b4 = (undefined4)(this->lexer_).text_pos_;
    std::__cxx11::wstringbuf::str();
    message._M_str = in_R9;
    message._M_len = (size_t)local_1b0._M_dataplus._M_p;
    syntax_error((parser *)"check_token",(char *)0x160,(int)&local_1c8,
                 (source_extend *)local_1b0._M_string_length,message);
  }
  if (1 < (int)this->version_) {
    tVar1 = this_00->type_;
    uVar6 = 3;
    lVar3 = 0;
    do {
      if (*(token_type *)((long)&es5_strict_reserved_tokens + lVar3) == tVar1) goto LAB_001905e4;
      if (*(token_type *)((long)&DAT_0021b654 + lVar3) == tVar1) {
        if (lVar3 == 0x20) {
          return;
        }
        goto LAB_001905e4;
      }
      if ((*(token_type *)((long)&DAT_0021b658 + lVar3) == tVar1) ||
         (*(token_type *)((long)&DAT_0021b65c + lVar3) == tVar1)) goto LAB_001905e4;
      lVar3 = lVar3 + 0x10;
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
    if (tVar1 == yield_) {
LAB_001905e4:
      if (this->strict_mode_ == true) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_190);
        pwVar4 = mjs::operator<<((wostream *)local_190,this_00->type_);
        pwVar4 = std::operator<<(pwVar4," is reserved in ");
        pbVar5 = mjs::operator<<(pwVar4,this->version_);
        std::operator<<(pbVar5," strict mode");
        local_1c8 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_1c0 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
          }
        }
        local_1b8 = this->token_start_;
        local_1b4 = (undefined4)(this->lexer_).text_pos_;
        std::__cxx11::wstringbuf::str();
        message_00._M_str = in_R9;
        message_00._M_len = (size_t)local_1b0._M_dataplus._M_p;
        syntax_error((parser *)"check_token",(char *)0x163,(int)&local_1c8,
                     (source_extend *)local_1b0._M_string_length,message_00);
      }
      token_string_abi_cxx11_(&local_1b0,(mjs *)(ulong)tVar1,0x21b650);
      token::token(local_190,identifier,&local_1b0);
      token::operator=(this_00,local_190);
      token::destroy(local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity * 4 + 4);
      }
    }
  }
  return;
}

Assistant:

void check_token() {
        current_token_ = lexer_.current_token();
        if (is_reserved(current_token_type(), version_)) {
            SYNTAX_ERROR(current_token_type() << " is reserved in " << version_);
        } else if (version_ >= version::es5 && find_token(current_token_type(), es5_strict_reserved_tokens)) {
            if (strict_mode_) {
                SYNTAX_ERROR(current_token_type() << " is reserved in " << version_ << " strict mode");
            }
            current_token_ = token{token_type::identifier, token_string(current_token_type())};
        }
    }